

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O2

Status __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::dualStatus(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxId *id)

{
  Status SVar1;
  SPxColId SStack_18;
  
  if ((id->super_DataKey).info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&SStack_18,id);
    SVar1 = dualStatus(this,(SPxRowId *)&SStack_18);
  }
  else {
    SPxColId::SPxColId(&SStack_18,id);
    SVar1 = dualStatus(this,&SStack_18);
  }
  return SVar1;
}

Assistant:

typename Desc::Status dualStatus(const SPxId& id) const
   {
      return id.isSPxRowId()
             ? dualStatus(SPxRowId(id))
             : dualStatus(SPxColId(id));
   }